

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

string * trimEnd(string *__return_storage_ptr__,string *input)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __const_iterator local_68;
  undefined1 local_48 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __const_iterator local_28;
  undefined1 local_19;
  string *local_18;
  string *input_local;
  string *result;
  
  local_19 = 0;
  local_18 = input;
  input_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,input);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rend
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,trimEnd(std::__cxx11::string_const&)::_lambda(char)_1_>
            (&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  local_30._M_current =
       (char *)std::
               reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::base(&local_38);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_28,&local_30);
  local_70._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                         (__return_storage_ptr__);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_68,&local_70);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (__return_storage_ptr__,local_28,local_68);
  return __return_storage_ptr__;
}

Assistant:

inline std::string trimEnd( std::string const & input )
{
  std::string result = input;
  result.erase( std::find_if( result.rbegin(), result.rend(), []( char c ) noexcept { return !std::isspace( c ); } ).base(), result.end() );
  return result;
}